

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetReflectionClassName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  FileDescriptor *extraout_RDX;
  FileDescriptor *descriptor_00;
  undefined1 auVar1 [16];
  string local_68;
  undefined1 local_38 [8];
  string result;
  FileDescriptor *descriptor_local;
  
  result.field_2._8_8_ = this;
  GetFileNamespace_abi_cxx11_((string *)local_38,this,descriptor);
  auVar1 = std::__cxx11::string::empty();
  descriptor_00 = auVar1._8_8_;
  if ((auVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::string::operator+=((string *)local_38,'.');
    descriptor_00 = extraout_RDX;
  }
  GetReflectionClassUnqualifiedName_abi_cxx11_
            (&local_68,(csharp *)result.field_2._8_8_,descriptor_00);
  std::__cxx11::string::operator+=((string *)local_38,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator+(__return_storage_ptr__,"global::",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GetReflectionClassName(const FileDescriptor* descriptor) {
  std::string result = GetFileNamespace(descriptor);
  if (!result.empty()) {
    result += '.';
  }
  result += GetReflectionClassUnqualifiedName(descriptor);
  return "global::" + result;
}